

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* jsonnet::internal::jsonnet_vm_execute_stream
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,Allocator *alloc,AST *ast,ExtMap *ext_vars,uint max_stack,
            double gc_min_objects,double gc_growth_trigger,VmNativeCallbackMap *natives,
            JsonnetImportCallback *import_callback,void *ctx,bool string_output)

{
  _func_int **pp_Var1;
  HeapEntity *context;
  ostream *poVar2;
  RuntimeError *__return_storage_ptr___00;
  Type t;
  LocationRange *pLVar3;
  _func_int **pp_Var4;
  allocator<char32_t> local_439;
  UString element;
  LocationRange loc;
  UString local_3b8;
  Interpreter vm;
  stringstream ss;
  ostream local_1a8 [376];
  
  anon_unknown_0::Interpreter::Interpreter
            (&vm,alloc,ext_vars,max_stack,gc_min_objects,gc_growth_trigger,natives,import_callback,
             ctx);
  anon_unknown_0::Interpreter::evaluate(&vm,ast,0);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"During manifestation",(allocator<char> *)&element);
  LocationRange::LocationRange(&loc,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if (vm.scratch.t == ARRAY) {
    pp_Var1 = *(_func_int ***)&vm.scratch.v.h[1].mark;
    for (pp_Var4 = vm.scratch.v.h[1]._vptr_HeapEntity; pp_Var4 != pp_Var1; pp_Var4 = pp_Var4 + 1) {
      context = (HeapEntity *)*pp_Var4;
      pLVar3 = (LocationRange *)(*(long *)&context[6].mark + 8);
      if (*(long *)&context[6].mark == 0) {
        pLVar3 = &loc;
      }
      LocationRange::LocationRange((LocationRange *)&ss,pLVar3);
      if (context->field_0xa == '\x01') {
        element._M_dataplus._M_p = (pointer)0x0;
        element._M_string_length = 0;
        element.field_2._M_allocated_capacity = 0;
        element.field_2._8_8_ = &element._M_string_length;
        anon_unknown_0::Stack::newCall
                  (&vm.stack,&loc,context,(HeapObject *)0x0,0,(BindingFrame *)&element);
        std::
        map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                *)&element);
        vm.stack.stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].val.t = vm.scratch.t;
        *(undefined4 *)
         &vm.stack.stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].val.field_0x4 = vm.scratch._4_4_;
        vm.stack.stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].val.v = vm.scratch.v;
        vm.scratch._0_8_ = context[1]._vptr_HeapEntity;
        vm.scratch.v = *(anon_union_8_3_4e909c26_for_v *)&context[1].mark;
      }
      else {
        anon_unknown_0::Stack::newCall
                  (&vm.stack,&loc,context,*(HeapObject **)&context[5].mark,
                   *(uint *)&context[6]._vptr_HeapEntity,(BindingFrame *)&context[2].mark);
        vm.stack.stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].val.t = vm.scratch.t;
        *(undefined4 *)
         &vm.stack.stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].val.field_0x4 = vm.scratch._4_4_;
        vm.stack.stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].val.v = vm.scratch.v;
        anon_unknown_0::Interpreter::evaluate
                  (&vm,*(AST **)&context[6].mark,
                   (uint)(((long)vm.stack.stack.
                                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)vm.stack.stack.
                                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 400));
      }
      if (string_output) {
        (anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
                  (&element,(Interpreter *)&vm,(LocationRange *)&ss);
      }
      else {
        std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                  ((u32string *)&local_3b8,L"",&local_439);
        anon_unknown_0::Interpreter::manifestJson(&element,&vm,(LocationRange *)&ss,true,&local_3b8)
        ;
        std::__cxx11::u32string::~u32string((u32string *)&local_3b8);
      }
      vm.scratch.t = vm.stack.stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].val.t;
      vm.scratch._4_4_ =
           *(undefined4 *)
            &vm.stack.stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].val.field_0x4;
      vm.scratch.v = vm.stack.stack.
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].val.v;
      anon_unknown_0::Stack::pop(&vm.stack);
      encode_utf8((string *)&local_3b8,&element);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::u32string::~u32string((u32string *)&element);
      std::__cxx11::string::~string((string *)&ss);
    }
    std::__cxx11::string::~string((string *)&loc);
    anon_unknown_0::Interpreter::~Interpreter(&vm);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a8,"stream mode: top-level object was a ");
  (anonymous_namespace)::type_str_abi_cxx11_
            ((string *)&element,(_anonymous_namespace_ *)(vm.scratch._0_8_ & 0xffffffff),t);
  poVar2 = std::operator<<(poVar2,(string *)&element);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(poVar2,"should be an array whose elements hold ");
  std::operator<<(poVar2,"the JSON for each document in the stream.");
  std::__cxx11::string::~string((string *)&element);
  __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  anon_unknown_0::Stack::makeError(__return_storage_ptr___00,&vm.stack,&loc,(string *)&element);
  __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

std::vector<std::string> jsonnet_vm_execute_stream(Allocator *alloc, const AST *ast,
                                                   const ExtMap &ext_vars, unsigned max_stack,
                                                   double gc_min_objects, double gc_growth_trigger,
                                                   const VmNativeCallbackMap &natives,
                                                   JsonnetImportCallback *import_callback,
                                                   void *ctx, bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    return vm.manifestStream(string_output);
}